

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readValue(OurReader *this)

{
  _Map_pointer pppVVar1;
  size_type sVar2;
  Value *this_00;
  pointer pcVar3;
  bool bVar4;
  _Elt_pointer ppVVar5;
  Value v;
  Token token;
  ValueHolder local_88 [2];
  long local_78 [3];
  Token local_60;
  String local_48;
  
  pppVVar1 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node;
  if ((this->features_).stackLimit_ <
      ((long)(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)pppVVar1 -
                (long)(this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppVVar1 == (_Map_pointer)0x0)) * 0x40) {
    local_88[0].string_ = (char *)local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Exceeded stackLimit in readValue().","");
    throwRuntimeError((String *)local_88);
  }
  skipCommentTokens(this,&local_60);
  if ((this->collectComments_ == true) &&
     (sVar2 = (this->commentsBefore_)._M_string_length, sVar2 != 0)) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this_00 = ppVVar5[-1];
    pcVar3 = (this->commentsBefore_)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar3,pcVar3 + sVar2);
    Value::setComment(this_00,&local_48,commentBefore);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    (this->commentsBefore_)._M_string_length = 0;
    *(this->commentsBefore_)._M_dataplus._M_p = '\0';
  }
  switch(local_60.type_) {
  case tokenObjectBegin:
    bVar4 = readObject(this,&local_60);
    goto LAB_007ca97e;
  case tokenObjectEnd:
  case tokenArrayEnd:
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_007ca668_default;
    this->current_ = this->current_ + -1;
    Value::Value((Value *)local_88,nullValue);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(ptrdiff_t)(this->current_ + ~(ulong)this->begin_));
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)this->current_ - (long)this->begin_);
    break;
  case tokenArrayBegin:
    bVar4 = readArray(this,&local_60);
LAB_007ca97e:
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)this->current_ - (long)this->begin_);
    goto LAB_007cab83;
  case tokenString:
    bVar4 = decodeString(this,&local_60);
    goto LAB_007cab83;
  case tokenNumber:
    bVar4 = decodeNumber(this,&local_60);
    goto LAB_007cab83;
  case tokenTrue:
    Value::Value((Value *)local_88,true);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    break;
  case tokenFalse:
    Value::Value((Value *)local_88,false);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    break;
  case tokenNull:
    Value::Value((Value *)local_88,nullValue);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    break;
  case tokenNaN:
    Value::Value((Value *)local_88,NAN);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    break;
  case tokenPosInf:
    Value::Value((Value *)local_88,INFINITY);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    break;
  case tokenNegInf:
    Value::Value((Value *)local_88,-INFINITY);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar5[-1],(Value *)local_88);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    break;
  default:
switchD_007ca668_default:
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetStart(ppVVar5[-1],(long)local_60.start_ - (long)this->begin_);
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setOffsetLimit(ppVVar5[-1],(long)local_60.end_ - (long)this->begin_);
    local_88[0].string_ = (char *)local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Syntax error: value, object or array expected.","");
    addError(this,(String *)local_88,&local_60,(Location)0x0);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0].string_,local_78[0] + 1);
    }
    return false;
  }
  Value::~Value((Value *)local_88);
  bVar4 = true;
LAB_007cab83:
  if (this->collectComments_ == true) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    this->lastValueHasAComment_ = false;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar5[-1];
  }
  return bVar4;
}

Assistant:

String Reader::normalizeEOL(Reader::Location begin, Reader::Location end) {
  String normalized;
  normalized.reserve(static_cast<size_t>(end - begin));
  Reader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
        // convert dos EOL
        ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}